

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryRegion.h
# Opt level: O2

void __thiscall
MT32Emu::Synth::readMemoryRegion
          (Synth *this,MemoryRegion *region,Bit32u addr,Bit32u len,Bit8u *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = region->entrySize;
  uVar3 = region->entries * uVar1 + region->startAddr;
  uVar2 = uVar3 - addr;
  if (len + addr <= uVar3) {
    uVar2 = len;
  }
  if (region->realMemory != (Bit8u *)0x0) {
    uVar2 = addr - region->startAddr;
    MemoryRegion::read(region,uVar2 / uVar1,(void *)((ulong)uVar2 % (ulong)uVar1),(size_t)data);
    return;
  }
  uVar1 = 1;
  while( true ) {
    if (uVar2 <= uVar1 - 1) break;
    data[uVar1 - 1] = 0xff;
    if (uVar1 < uVar2) {
      data[uVar1] = (char)region->type;
    }
    uVar1 = uVar1 + 2;
  }
  return;
}

Assistant:

int offset(Bit32u addr) const {
		return addr - startAddr;
	}